

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O1

void ypr_encode(ly_out *out,char *text,ssize_t len)

{
  size_t sVar1;
  char *buf;
  size_t len_00;
  char *buf_00;
  byte bVar2;
  
  if (len == 0) {
    return;
  }
  if (len < 0) {
    len = strlen(text);
  }
  len_00 = 0;
  buf_00 = text;
  if (len != 0) {
    sVar1 = 0;
    do {
      bVar2 = text[sVar1];
      if (((1 < bVar2 - 9) && (bVar2 != 0x22)) && (bVar2 != 0x5c)) {
        len_00 = len_00 + 1;
        bVar2 = 0;
      }
      if (bVar2 != 0) {
        ly_write_(out,buf_00,len_00);
        if (bVar2 < 0x22) {
          if (bVar2 == 9) {
            buf = "\\t";
            goto LAB_00192c19;
          }
          buf = "\\n";
          if (bVar2 == 10) goto LAB_00192c19;
        }
        else {
          if (bVar2 == 0x22) {
            buf = "\\\"";
          }
          else {
            if (bVar2 != 0x5c) goto LAB_00192c26;
            buf = "\\\\";
          }
LAB_00192c19:
          ly_write_(out,buf,2);
        }
LAB_00192c26:
        buf_00 = buf_00 + len_00 + 1;
        len_00 = 0;
      }
      sVar1 = sVar1 + 1;
    } while (len != sVar1);
  }
  ly_write_(out,buf_00,len_00);
  return;
}

Assistant:

static void
ypr_encode(struct ly_out *out, const char *text, ssize_t len)
{
    size_t i, start_len;
    const char *start;
    char special = 0;

    if (!len) {
        return;
    }

    if (len < 0) {
        len = strlen(text);
    }

    start = text;
    start_len = 0;
    for (i = 0; i < (size_t)len; ++i) {
        switch (text[i]) {
        case '\n':
        case '\t':
        case '\"':
        case '\\':
            special = text[i];
            break;
        default:
            ++start_len;
            break;
        }

        if (special) {
            ly_write_(out, start, start_len);
            switch (special) {
            case '\n':
                ly_write_(out, "\\n", 2);
                break;
            case '\t':
                ly_write_(out, "\\t", 2);
                break;
            case '\"':
                ly_write_(out, "\\\"", 2);
                break;
            case '\\':
                ly_write_(out, "\\\\", 2);
                break;
            }

            start += start_len + 1;
            start_len = 0;

            special = 0;
        }
    }

    ly_write_(out, start, start_len);
}